

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O3

void Mpm_ManPrecomputePerms(Mpm_Man_t *p)

{
  char (*pacVar1) [6];
  char cVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int *__ptr;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  undefined1 (*__ptr_00) [16];
  Vec_Wrd_t *pVVar9;
  word *pwVar10;
  Hsh_IntMan_t *pHVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  char (*pacVar21) [6];
  uint uVar22;
  word Entry;
  undefined1 auVar23 [16];
  timespec ts;
  timespec local_68;
  long local_58;
  int *local_50;
  ulong local_48;
  word *local_40;
  long local_38;
  long lVar24;
  
  uVar4 = Extra_Factorial(6);
  iVar5 = clock_gettime(3,&local_68);
  if (iVar5 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (p->pDsd6 != (Mpm_Dsd_t *)0x0) {
    __assert_fail("p->pDsd6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x2fe,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  p->pDsd6 = s_DsdClass6;
  local_50 = Extra_GreyCodeSchedule(6);
  __ptr = Extra_PermSchedule(6);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x40000;
  piVar7 = (int *)malloc(0x100000);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 0x40000;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,0x100000);
  }
  p->vMap2Perm = pVVar6;
  auVar3 = _DAT_0094e250;
  pacVar1 = p->Perm6;
  lVar8 = 0;
  auVar23 = _DAT_0094e240;
  do {
    if (SUB164(auVar23 ^ auVar3,4) == -0x80000000 && SUB164(auVar23 ^ auVar3,0) < -0x7ffffffa) {
      p->Perm6[0][lVar8] = (char)lVar8;
      p->Perm6[0][lVar8 + 1] = (char)lVar8 + '\x01';
    }
    lVar8 = lVar8 + 2;
    lVar24 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 2;
    auVar23._8_8_ = lVar24 + 2;
  } while (lVar8 != 6);
  uVar14 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar16 = 0x2c688;
    uVar19 = 0;
    pacVar21 = pacVar1;
    do {
      if (uVar19 != 0) {
        lVar8 = -6;
        do {
          pacVar21[1][lVar8] = (*pacVar21)[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
      }
      lVar8 = (long)__ptr[uVar19];
      cVar2 = pacVar1[uVar19][lVar8];
      pacVar1[uVar19][lVar8] = pacVar1[uVar19][lVar8 + 1];
      pacVar1[uVar19][(long)__ptr[uVar19] + 1] = cVar2;
      bVar12 = (char)__ptr[uVar19] * '\x03';
      uVar22 = ((int)uVar16 >> (bVar12 + 3 & 0x1f) ^ (int)uVar16 >> (bVar12 & 0x1f)) & 7;
      uVar16 = uVar16 ^ uVar22 << (bVar12 + 3 & 0x1f) ^ uVar22 << (bVar12 & 0x1f);
      if (((int)uVar16 < 0) || (p->vMap2Perm->nSize <= (int)uVar16)) goto LAB_008d3ea3;
      p->vMap2Perm->pArray[uVar16] = (int)uVar19;
      uVar19 = uVar19 + 1;
      pacVar21 = pacVar21 + 1;
    } while (uVar19 != uVar14);
    if (uVar16 != 0x2c688) {
      __assert_fail("OneCopy == One",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,800,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
  }
  __ptr_00 = (undefined1 (*) [16])malloc(0x40);
  if (0 < p->vMap2Perm->nSize) {
    uVar19 = 0;
    do {
      *__ptr_00 = (undefined1  [16])0x0;
      *(undefined8 *)__ptr_00[1] = 0;
      iVar5 = 0;
      iVar15 = 0;
      do {
        uVar16 = (uint)uVar19 >> ((byte)iVar5 & 0x1f) & 7;
        if (uVar16 < 6) {
          if (*(int *)(*__ptr_00 + (ulong)uVar16 * 4) == 1) goto LAB_008d3ca9;
          *(undefined4 *)(*__ptr_00 + (ulong)uVar16 * 4) = 1;
          iVar15 = iVar15 + 1;
        }
        else if (uVar16 != 7) goto LAB_008d3ca9;
        iVar5 = iVar5 + 3;
      } while (iVar5 != 0x12);
      if (iVar15 != 6) {
        lVar8 = 0;
        uVar16 = 0;
        do {
          if (*(int *)(*__ptr_00 + lVar8 * 4) == 0) {
            if (5 < uVar16) goto LAB_008d3ea3;
            uVar17 = (ulong)uVar16;
            uVar16 = uVar16 + 1;
            *(int *)(*__ptr_00 + uVar17 * 4) = (int)lVar8;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        if (6 < (int)uVar16) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        iVar5 = 0;
        uVar18 = uVar19 & 0xffffffff;
        uVar17 = 0;
        do {
          uVar20 = uVar17;
          if ((~((int)(uint)uVar18 >> ((byte)iVar5 & 0x1f)) & 7U) == 0) {
            iVar15 = (int)uVar17;
            if ((iVar15 < 0) || ((int)uVar16 <= iVar15)) goto LAB_008d3ec2;
            uVar20 = (ulong)(iVar15 + 1);
            uVar18 = (ulong)((uint)uVar18 ^
                            (*(uint *)(*__ptr_00 + uVar17 * 4) ^ 7) << ((byte)iVar5 & 0x1f));
          }
          iVar5 = iVar5 + 3;
          uVar17 = uVar20;
        } while (iVar5 != 0x12);
        if ((uint)uVar20 != uVar16) {
          __assert_fail("x == Vec_IntSize(vVars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                        ,0x346,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
        }
        if ((int)uVar18 < 0) {
LAB_008d3ec2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = p->vMap2Perm->nSize;
        if ((int)uVar16 <= (int)uVar18) goto LAB_008d3ec2;
        piVar7 = p->vMap2Perm->pArray;
        iVar5 = piVar7[uVar18];
        if (iVar5 == -1) {
          __assert_fail("Vec_IntEntry( p->vMap2Perm, One ) != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                        ,0x348,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
        }
        if (uVar16 <= uVar19) {
LAB_008d3ea3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar7[uVar19] = iVar5;
      }
LAB_008d3ca9:
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)p->vMap2Perm->nSize);
  }
  if (__ptr_00 != (undefined1 (*) [16])0x0) {
    free(__ptr_00);
  }
  local_48 = uVar14;
  if (p->vPerm6 != (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vPerm6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x355,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  pVVar9 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < uVar4 * 0x253 - 1) {
    iVar5 = uVar4 * 0x253;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar5;
  local_58 = lVar13;
  if (iVar5 == 0) {
    pwVar10 = (word *)0x0;
  }
  else {
    pwVar10 = (word *)malloc((long)iVar5 << 3);
  }
  uVar14 = local_48;
  pVVar9->pArray = pwVar10;
  p->vPerm6 = pVVar9;
  lVar13 = 0;
  do {
    if (0 < (int)uVar4) {
      local_40 = &s_DsdClass6[lVar13].uTruth;
      Entry = *local_40;
      uVar19 = 0;
      local_38 = lVar13;
      do {
        iVar5 = __ptr[uVar19];
        bVar12 = (byte)(1L << ((byte)iVar5 & 0x3f));
        Entry = (Entry & s_PMasks[iVar5][2]) >> (bVar12 & 0x3f) |
                (s_PMasks[iVar5][1] & Entry) << (bVar12 & 0x3f) | s_PMasks[iVar5][0] & Entry;
        Vec_WrdPush(p->vPerm6,Entry);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
      lVar13 = local_38;
      if (Entry != *local_40) {
        __assert_fail("uTruth == s_DsdClass6[i].uTruth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                      ,0x35f,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
      }
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 0x253) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      lVar13 = local_58;
      if (local_50 != (int *)0x0) {
        free(local_50);
      }
      pHVar11 = Mpm_ManBuildHashTable(&p->vConfgRes);
      p->pHash = pHVar11;
      iVar15 = 3;
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar15,"%s =","Setting up DSD information");
      Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar8 + lVar13) / 1000000.0);
      return;
    }
  } while( true );
}

Assistant:

void Mpm_ManPrecomputePerms( Mpm_Man_t * p )
{
    int nVars = 6;
    // 0(1:1) 1(2:1) 2(4:2) 3(10:6) 4(33:23) 5(131:98) 6(595:464)
    int nClasses[7] = { 1, 2, 4, 10, 33, 131, 595 };
    int nPerms = Extra_Factorial( nVars );
//    int nSwaps = (1 << nVars);
    int * pComp, * pPerm;
    int i, k, x, One, OneCopy, Num;
    Vec_Int_t * vVars;
    abctime clk = Abc_Clock();
    assert( p->pDsd6 == NULL );
    p->pDsd6 = s_DsdClass6;
    // precompute schedules
    pComp = Extra_GreyCodeSchedule( nVars );
    pPerm = Extra_PermSchedule( nVars );
    // map numbers into perms
    p->vMap2Perm = Vec_IntStartFull( (1<<(3*nVars)) );
    // store permutations
    One = 0;
    for ( x = 0; x < nVars; x++ )
    {
        p->Perm6[0][x] = (char)x;
        One |= (x << (3*x));
    }
//    Vec_IntWriteEntry( p->vMap2Perm, One, 0 );
    OneCopy = One;
    for ( k = 0; k < nPerms; k++ )
    {
        if ( k > 0 )
        for ( x = 0; x < nVars; x++ )
            p->Perm6[k][x] = p->Perm6[k-1][x];
        ABC_SWAP( char, p->Perm6[k][pPerm[k]], p->Perm6[k][pPerm[k]+1] );

        Num = ( (One >> (3*(pPerm[k]  ))) ^ (One >> (3*(pPerm[k]+1))) ) & 7;
        One ^=  (Num << (3*(pPerm[k]  )));
        One ^=  (Num << (3*(pPerm[k]+1)));

        Vec_IntWriteEntry( p->vMap2Perm, One, k );
        
//        Mpm_ManPrintPerm( One );
//        for ( x = 0; x < nVars; x++ )
//            printf( "%d ", p->Perm6[k][x] );
//        printf( "\n" );
    }
    assert( OneCopy == One );
    // fill in the gaps
    vVars = Vec_IntAlloc( 6 );
    Vec_IntForEachEntry( p->vMap2Perm, Num, i )
    {
        // mark used variables
        int Count = 0;
        One = i;
        Vec_IntFill( vVars, 6, 0 );
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar >= nVars && iVar < 7 )
                break;
            if ( iVar != 7 )
            {
                if ( Vec_IntEntry( vVars, iVar ) == 1 )
                    break;
                Vec_IntWriteEntry( vVars, iVar, 1 );
                Count++;
            }
        }
        // skip ones with dups and complete
        if ( k < nVars || Count == nVars )
            continue;
        // find unused variables
        for ( x = k = 0; k < 6; k++ )
            if ( Vec_IntEntry(vVars, k) == 0 )
                Vec_IntWriteEntry( vVars, x++, k );
        Vec_IntShrink( vVars, x );
        // fill in used variables
        x = 0;
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar == 7 )
                One ^= ((Vec_IntEntry(vVars, x++) ^ 7) << (3*k));
        }
        assert( x == Vec_IntSize(vVars) );
        // save this one
        assert( Vec_IntEntry( p->vMap2Perm, One ) != -1 );
        Vec_IntWriteEntry( p->vMap2Perm, i, Vec_IntEntry(p->vMap2Perm, One) );
/*
        // mapping
        Mpm_ManPrintPerm( i );
        printf( "->  " );
        Mpm_ManPrintPerm( One );
        printf( "\n" );
*/
    }
    Vec_IntFree( vVars );

    // store permuted truth tables
    assert( p->vPerm6 == NULL );
    p->vPerm6 = Vec_WrdAlloc( nPerms * 595 );
    for ( i = 0; i < nClasses[nVars]; i++ )
    {
        word uTruth = s_DsdClass6[i].uTruth;
        for ( k = 0; k < nPerms; k++ )
        {
            uTruth = Abc_Tt6SwapAdjacent( uTruth, pPerm[k] );
            Vec_WrdPush( p->vPerm6, uTruth );
        }
        assert( uTruth == s_DsdClass6[i].uTruth );
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // build hash table
    p->pHash = Mpm_ManBuildHashTable( &p->vConfgRes );
    Abc_PrintTime( 1, "Setting up DSD information", Abc_Clock() - clk );
}